

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::TextureVkImpl::CreateStagingTexture
          (TextureVkImpl *this,TextureData *pInitData,TextureFormatAttribs *FmtAttribs)

{
  TextureDesc *pTVar1;
  VkDeviceMemory memory;
  VkDeviceSize VVar2;
  TextureSubResData *pTVar3;
  CPU_ACCESS_FLAGS CVar4;
  uint uVar5;
  VkResult errorCode;
  RenderDeviceVkImpl *pRVar6;
  VulkanMemoryPage *pVVar7;
  VkDeviceSize VVar8;
  uint8_t *puVar9;
  Uint64 UVar10;
  uint uVar11;
  char (*Args_1) [118];
  Uint32 layer;
  Uint32 UVar12;
  VkMemoryPropertyFlags MemoryProps;
  char (*Args_2) [23];
  char *Args_2_00;
  int iVar13;
  ulong memoryOffset;
  Uint32 MipLevel;
  element_type *peVar14;
  bool bVar15;
  string msg;
  string StagingBufferName;
  VkMemoryRequirements StagingBufferMemReqs;
  undefined1 local_f8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_e8;
  Uint64 local_d8;
  long *local_c8 [2];
  long local_b8 [2];
  element_type *local_a8;
  ulong local_a0;
  VkBufferCreateInfo local_98;
  TextureFormatAttribs *local_60;
  TextureDesc *local_58;
  TextureData *local_50;
  VkMemoryRequirements local_48;
  
  if ((pInitData == (TextureData *)0x0) || (pInitData->pSubResources == (TextureSubResData *)0x0)) {
    bVar15 = false;
  }
  else {
    bVar15 = pInitData->NumSubresources != 0;
  }
  local_60 = FmtAttribs;
  local_50 = pInitData;
  pRVar6 = DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
           ::GetDevice((DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                        *)this);
  peVar14 = (pRVar6->m_LogicalVkDevice).
            super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  local_98.pNext = (void *)0x0;
  local_98.size = 0;
  local_98.usage = 0;
  local_98.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_98.queueFamilyIndexCount = 0;
  local_98._44_4_ = 0;
  local_98.pQueueFamilyIndices = (uint32_t *)0x0;
  local_98.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  local_98._4_4_ = 0;
  local_98.flags = 0;
  local_98._20_4_ = 0;
  pTVar1 = &(this->super_TextureBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
            .m_Desc;
  UVar12 = 1;
  uVar5 = (uint)(this->super_TextureBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                .m_Desc.Type;
  if ((uVar5 < 9) && ((0x1a8U >> (uVar5 & 0x1f) & 1) != 0)) {
    UVar12 = (this->super_TextureBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
             .m_Desc.field_3.ArraySize;
  }
  Args_2 = (char (*) [23])0x0;
  local_98.size = GetStagingTextureLocationOffset(pTVar1,UVar12,0,0x10,0,0,0);
  CVar4 = (this->super_TextureBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
          .m_Desc.CPUAccessFlags;
  if (1 < (byte)((CVar4 & (CPU_ACCESS_FLAG_LAST|CPU_ACCESS_READ)) - CPU_ACCESS_READ)) {
    FormatString<char[75]>
              ((string *)local_f8,
               (char (*) [75])
               "Exactly one of CPU_ACCESS_READ or CPU_ACCESS_WRITE flags must be specified");
    DebugAssertionFailed
              ((Char *)local_f8,"CreateStagingTexture",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x256);
    if (local_f8 != (undefined1  [8])&aStack_e8) {
      operator_delete((void *)local_f8,aStack_e8._M_allocated_capacity + 1);
    }
    CVar4 = (this->super_TextureBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
            .m_Desc.CPUAccessFlags;
  }
  local_a8 = peVar14;
  if ((CVar4 & CPU_ACCESS_READ) == CPU_ACCESS_NONE) {
    if ((CVar4 & CPU_ACCESS_FLAG_LAST) == CPU_ACCESS_NONE) {
      FormatString<char[22]>((string *)local_f8,(char (*) [22])"Unexpected CPU access");
      DebugAssertionFailed
                ((Char *)local_f8,"CreateStagingTexture",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                 ,0x271);
      if (local_f8 != (undefined1  [8])&aStack_e8) {
        operator_delete((void *)local_f8,aStack_e8._M_allocated_capacity + 1);
      }
      MemoryProps = 2;
    }
    else {
      local_98.usage = 1;
      (this->super_TextureBase<Diligent::EngineVkImplTraits>).m_State = RESOURCE_STATE_COPY_SOURCE;
      MemoryProps = 6;
    }
  }
  else {
    if (bVar15) {
      FormatString<char[54]>
                ((string *)local_f8,
                 (char (*) [54])"Readback textures should not be initialized with data");
      DebugAssertionFailed
                ((Char *)local_f8,"CreateStagingTexture",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                 ,0x25b);
      if (local_f8 != (undefined1  [8])&aStack_e8) {
        operator_delete((void *)local_f8,aStack_e8._M_allocated_capacity + 1);
      }
    }
    local_98.usage = 2;
    (this->super_TextureBase<Diligent::EngineVkImplTraits>).m_State = RESOURCE_STATE_COPY_DEST;
    pRVar6 = DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
             ::GetDevice((DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                          *)this);
    VVar2 = local_98.size;
    local_c8[0] = *(long **)((long)&(((pRVar6->m_PhysicalDevice)._M_t.
                                      super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
                                      .
                                      super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>
                                     ._M_head_impl)->m_Properties).limits + 0x1f0);
    if (((ulong)local_c8[0] ^ (long)local_c8[0] - 1U) <= (long)local_c8[0] - 1U) {
      FormatString<char[12],unsigned_long,char[23]>
                ((string *)local_f8,(Diligent *)"Alignment (",(char (*) [12])local_c8,
                 (unsigned_long *)") must be a power of 2",Args_2);
      DebugAssertionFailed
                ((Char *)local_f8,"AlignUp",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
                 ,0x34);
      if (local_f8 != (undefined1  [8])&aStack_e8) {
        operator_delete((void *)local_f8,aStack_e8._M_allocated_capacity + 1);
      }
    }
    local_98.size = -(long)local_c8[0] & (long)local_c8[0] + (VVar2 - 1);
    MemoryProps = 10;
    peVar14 = local_a8;
  }
  local_98.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_98.queueFamilyIndexCount = 0;
  local_98.pQueueFamilyIndices = (uint32_t *)0x0;
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"Staging buffer for \'","");
  std::__cxx11::string::append((char *)local_c8);
  std::__cxx11::string::push_back((char)local_c8);
  VulkanUtilities::VulkanLogicalDevice::CreateBuffer
            ((BufferWrapper *)local_f8,peVar14,&local_98,(char *)local_c8[0]);
  VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
  operator=(&this->m_StagingBuffer,
            (VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *)local_f8);
  VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
  ~VulkanObjectWrapper
            ((VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *)local_f8);
  VulkanUtilities::VulkanLogicalDevice::GetBufferMemoryRequirements
            (&local_48,peVar14,(this->m_StagingBuffer).m_VkObject);
  if ((local_48.alignment ^ local_48.alignment - 1) <= local_48.alignment - 1) {
    FormatString<char[29]>((string *)local_f8,(char (*) [29])"Alignment is not power of 2!");
    DebugAssertionFailed
              ((Char *)local_f8,"CreateStagingTexture",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x27d);
    if (local_f8 != (undefined1  [8])&aStack_e8) {
      operator_delete((void *)local_f8,aStack_e8._M_allocated_capacity + 1);
    }
  }
  pRVar6 = DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
           ::GetDevice((DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                        *)this);
  Args_2_00 = (char *)0x0;
  VulkanUtilities::VulkanMemoryManager::Allocate
            ((VulkanMemoryAllocation *)local_f8,&pRVar6->m_MemoryMgr,&local_48,MemoryProps,0);
  (this->m_MemoryAllocation).Page = (VulkanMemoryPage *)local_f8;
  (this->m_MemoryAllocation).UnalignedOffset = (VkDeviceSize)_Stack_f0._M_pi;
  (this->m_MemoryAllocation).Size = aStack_e8._M_allocated_capacity;
  local_f8 = (undefined1  [8])0x0;
  _Stack_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  aStack_e8._M_allocated_capacity = 0;
  VulkanUtilities::VulkanMemoryAllocation::~VulkanMemoryAllocation
            ((VulkanMemoryAllocation *)local_f8);
  pVVar7 = (this->m_MemoryAllocation).Page;
  if (pVVar7 == (VulkanMemoryPage *)0x0) {
    Args_2_00 = "Failed to allocate memory for staging texture \'";
    LogError<true,char[48],char_const*,char[3]>
              (false,"CreateStagingTexture",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x281,(char (*) [48])"Failed to allocate memory for staging texture \'",
               (char **)pTVar1,(char (*) [3])"\'.");
    pVVar7 = (this->m_MemoryAllocation).Page;
  }
  memory = (pVVar7->m_VkMemory).m_VkObject;
  VVar2 = (this->m_MemoryAllocation).UnalignedOffset;
  local_a0 = local_48.alignment;
  VVar8 = VVar2;
  local_58 = pTVar1;
  if ((local_48.alignment ^ local_48.alignment - 1) <= local_48.alignment - 1) {
    FormatString<char[12],unsigned_long,char[23]>
              ((string *)local_f8,(Diligent *)"Alignment (",(char (*) [12])&local_a0,
               (unsigned_long *)") must be a power of 2",(char (*) [23])Args_2_00);
    DebugAssertionFailed
              ((Char *)local_f8,"AlignUp",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
               ,0x34);
    if (local_f8 != (undefined1  [8])&aStack_e8) {
      operator_delete((void *)local_f8,aStack_e8._M_allocated_capacity + 1);
    }
    VVar8 = (this->m_MemoryAllocation).UnalignedOffset;
  }
  peVar14 = local_a8;
  memoryOffset = -local_a0 & (VVar2 + local_a0) - 1;
  Args_1 = (char (*) [118])((local_48.size + memoryOffset) - VVar8);
  if ((char (*) [118])(this->m_MemoryAllocation).Size < Args_1) {
    FormatString<char[26],char[118]>
              ((string *)local_f8,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "m_MemoryAllocation.Size >= StagingBufferMemReqs.size + (AlignedStagingMemOffset - m_MemoryAllocation.UnalignedOffset)"
               ,Args_1);
    DebugAssertionFailed
              ((Char *)local_f8,"CreateStagingTexture",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x285);
    if (local_f8 != (undefined1  [8])&aStack_e8) {
      operator_delete((void *)local_f8,aStack_e8._M_allocated_capacity + 1);
    }
  }
  errorCode = VulkanUtilities::VulkanLogicalDevice::BindBufferMemory
                        (peVar14,(this->m_StagingBuffer).m_VkObject,memory,memoryOffset);
  if (errorCode != VK_SUCCESS) {
    local_f8 = (undefined1  [8])VulkanUtilities::VkResultToString(errorCode);
    LogError<true,char[37],char[17],char_const*>
              (false,"CreateStagingTexture",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x288,(char (*) [37])"Failed to bind staging buffer memory",
               (char (*) [17])"\nVK Error Code: ",(char **)local_f8);
  }
  this->m_StagingDataAlignedOffset = memoryOffset;
  if (bVar15) {
    puVar9 = GetStagingDataCPUAddress(this);
    pTVar1 = local_58;
    iVar13 = 0;
    UVar12 = 0;
    while( true ) {
      uVar5 = 1;
      uVar11 = (uint)(this->super_TextureBase<Diligent::EngineVkImplTraits>).
                     super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                     .m_Desc.Type;
      if ((uVar11 < 9) && ((0x1a8U >> (uVar11 & 0x1f) & 1) != 0)) {
        uVar5 = (this->super_TextureBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                .m_Desc.field_3.ArraySize;
      }
      if (uVar5 <= UVar12) break;
      if ((this->super_TextureBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
          .m_Desc.MipLevels != 0) {
        MipLevel = 0;
        do {
          pTVar3 = local_50->pSubResources;
          GetMipLevelProperties((MipLevelProperties *)local_f8,pTVar1,MipLevel);
          UVar10 = GetStagingTextureLocationOffset(pTVar1,UVar12,MipLevel,0x10,0,0,0);
          CopyTextureSubresource
                    (pTVar3 + (iVar13 + MipLevel),_Stack_f0._M_pi._4_4_ / local_60->BlockHeight,
                     aStack_e8._M_allocated_capacity._0_4_,aStack_e8._8_8_,puVar9 + UVar10,
                     aStack_e8._8_8_,local_d8);
          MipLevel = MipLevel + 1;
        } while (MipLevel <
                 (this->super_TextureBase<Diligent::EngineVkImplTraits>).
                 super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                 .m_Desc.MipLevels);
        iVar13 = iVar13 + MipLevel;
      }
      UVar12 = UVar12 + 1;
    }
  }
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0],local_b8[0] + 1);
  }
  return;
}

Assistant:

void TextureVkImpl::CreateStagingTexture(const TextureData* pInitData, const TextureFormatAttribs& FmtAttribs)
{
    const bool                                  bInitializeTexture = (pInitData != nullptr && pInitData->pSubResources != nullptr && pInitData->NumSubresources > 0);
    const VulkanUtilities::VulkanLogicalDevice& LogicalDevice      = GetDevice()->GetLogicalDevice();

    VkBufferCreateInfo VkStagingBuffCI = {};

    VkStagingBuffCI.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
    VkStagingBuffCI.pNext = nullptr;
    VkStagingBuffCI.flags = 0;
    VkStagingBuffCI.size  = GetStagingTextureDataSize(m_Desc, StagingBufferOffsetAlignment);

    // clang-format off
        DEV_CHECK_ERR((m_Desc.CPUAccessFlags & (CPU_ACCESS_READ | CPU_ACCESS_WRITE)) == CPU_ACCESS_READ ||
                      (m_Desc.CPUAccessFlags & (CPU_ACCESS_READ | CPU_ACCESS_WRITE)) == CPU_ACCESS_WRITE,
                      "Exactly one of CPU_ACCESS_READ or CPU_ACCESS_WRITE flags must be specified");
    // clang-format on
    VkMemoryPropertyFlags MemProperties = VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT;
    if (m_Desc.CPUAccessFlags & CPU_ACCESS_READ)
    {
        DEV_CHECK_ERR(!bInitializeTexture, "Readback textures should not be initialized with data");

        VkStagingBuffCI.usage = VK_BUFFER_USAGE_TRANSFER_DST_BIT;
        MemProperties |= VK_MEMORY_PROPERTY_HOST_CACHED_BIT;
        SetState(RESOURCE_STATE_COPY_DEST);

        // We do not set HOST_COHERENT bit, so we will have to use InvalidateMappedMemoryRanges,
        // which requires the ranges to be aligned by nonCoherentAtomSize.
        const VkPhysicalDeviceLimits& DeviceLimits = GetDevice()->GetPhysicalDevice().GetProperties().limits;
        // Align the buffer size to ensure that any aligned range is always in bounds.
        VkStagingBuffCI.size = AlignUp(VkStagingBuffCI.size, DeviceLimits.nonCoherentAtomSize);
    }
    else if (m_Desc.CPUAccessFlags & CPU_ACCESS_WRITE)
    {
        VkStagingBuffCI.usage = VK_BUFFER_USAGE_TRANSFER_SRC_BIT;
        // VK_MEMORY_PROPERTY_HOST_COHERENT_BIT bit specifies that the host cache management commands vkFlushMappedMemoryRanges
        // and vkInvalidateMappedMemoryRanges are NOT needed to flush host writes to the device or make device writes visible
        // to the host (10.2)
        MemProperties |= VK_MEMORY_PROPERTY_HOST_COHERENT_BIT;
        SetState(RESOURCE_STATE_COPY_SOURCE);
    }
    else
        UNEXPECTED("Unexpected CPU access");

    VkStagingBuffCI.sharingMode           = VK_SHARING_MODE_EXCLUSIVE;
    VkStagingBuffCI.queueFamilyIndexCount = 0;
    VkStagingBuffCI.pQueueFamilyIndices   = nullptr;

    std::string StagingBufferName = "Staging buffer for '";
    StagingBufferName += m_Desc.Name;
    StagingBufferName += '\'';
    m_StagingBuffer = LogicalDevice.CreateBuffer(VkStagingBuffCI, StagingBufferName.c_str());

    VkMemoryRequirements StagingBufferMemReqs = LogicalDevice.GetBufferMemoryRequirements(m_StagingBuffer);
    VERIFY(IsPowerOfTwo(StagingBufferMemReqs.alignment), "Alignment is not power of 2!");

    m_MemoryAllocation = GetDevice()->AllocateMemory(StagingBufferMemReqs, MemProperties);
    if (!m_MemoryAllocation)
        LOG_ERROR_AND_THROW("Failed to allocate memory for staging texture '", m_Desc.Name, "'.");

    VkDeviceMemory StagingBufferMemory     = m_MemoryAllocation.Page->GetVkMemory();
    VkDeviceSize   AlignedStagingMemOffset = AlignUp(m_MemoryAllocation.UnalignedOffset, StagingBufferMemReqs.alignment);
    VERIFY_EXPR(m_MemoryAllocation.Size >= StagingBufferMemReqs.size + (AlignedStagingMemOffset - m_MemoryAllocation.UnalignedOffset));

    VkResult err = LogicalDevice.BindBufferMemory(m_StagingBuffer, StagingBufferMemory, AlignedStagingMemOffset);
    CHECK_VK_ERROR_AND_THROW(err, "Failed to bind staging buffer memory");

    m_StagingDataAlignedOffset = AlignedStagingMemOffset;

    if (bInitializeTexture)
    {
        uint8_t* const pStagingData = GetStagingDataCPUAddress();

        Uint32 subres = 0;
        for (Uint32 layer = 0; layer < m_Desc.GetArraySize(); ++layer)
        {
            for (Uint32 mip = 0; mip < m_Desc.MipLevels; ++mip)
            {
                const TextureSubResData& SubResData = pInitData->pSubResources[subres++];
                const MipLevelProperties MipProps   = GetMipLevelProperties(m_Desc, mip);

                const Uint64 DstSubresOffset =
                    GetStagingTextureSubresourceOffset(m_Desc, layer, mip, StagingBufferOffsetAlignment);

                CopyTextureSubresource(SubResData,
                                       MipProps.StorageHeight / FmtAttribs.BlockHeight, // NumRows
                                       MipProps.Depth,
                                       MipProps.RowSize,
                                       pStagingData + DstSubresOffset,
                                       MipProps.RowSize,       // DstRowStride
                                       MipProps.DepthSliceSize // DstDepthStride
                );
            }
        }
    }
}